

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86rapass.cpp
# Opt level: O2

Error __thiscall asmjit::v1_14::x86::X86RAPass::emitPreCall(X86RAPass *this,InvokeNode *invokeNode)

{
  FuncDetail *this_00;
  uint uVar1;
  BaseBuilder *this_01;
  Error EVar2;
  FuncValuePack *pFVar3;
  FuncValue *pFVar4;
  OperandSignature *pOVar5;
  uint8_t *puVar6;
  uint32_t valueIndex;
  size_t sVar7;
  InstId instId;
  size_t sVar8;
  uint uVar9;
  uint32_t argIndex;
  Operand_ local_58;
  ulong local_48;
  Xmm src;
  
  if ((invokeNode->field_0xf5 != -1) &&
     (((((this->super_BaseRAPass).super_FuncPass.super_Pass._cb)->super_BaseEmitter)._environment.
       _arch & k32BitMask) == kUnknown)) {
    this_00 = &invokeNode->_funcDetail;
    local_48 = (ulong)(byte)invokeNode->field_0xf4;
    if (invokeNode->field_0x81 == '!') {
      for (sVar8 = 0; sVar8 != local_48; sVar8 = sVar8 + 1) {
        pFVar3 = FuncDetail::argPack(this_00,sVar8);
        for (sVar7 = 0; sVar7 != 4; sVar7 = sVar7 + 1) {
          pFVar4 = FuncValuePack::operator[](pFVar3,sVar7);
          uVar9 = pFVar4->_data;
          if (uVar9 == 0) break;
          if ((uVar9 >> 8 & 1) != 0) {
            local_58._signature._bits._0_1_ = (char)(uVar9 >> 0x18);
            pOVar5 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                     operator[]<asmjit::v1_14::RegType>
                               ((Array<asmjit::v1_14::OperandSignature,_32UL> *)(_archTraits + 0xec)
                                ,(RegType *)&local_58);
            if ((pOVar5->_bits & 0xf00) == 0x100) {
              puVar6 = CallConv::passedOrder((CallConv *)this_00,k0);
              local_58._baseId._0_1_ = puVar6[sVar8];
              local_58._signature._bits = 0x8000039;
              local_58._baseId._1_3_ = 0;
              local_58._data[0] = 0;
              local_58._data[1] = 0;
              src.super_Vec.super_Reg.super_BaseReg.super_Operand.super_Operand_._signature._bits =
                   0x10000161;
              src.super_Vec.super_Reg.super_BaseReg.super_Operand.super_Operand_._baseId =
                   (uint32_t)*(byte *)((long)&pFVar4->_data + 2);
              src.super_Vec.super_Reg.super_BaseReg.super_Operand.super_Operand_._data[0] = 0;
              src.super_Vec.super_Reg.super_BaseReg.super_Operand.super_Operand_._data[1] = 0;
              instId = 0x1d3;
              if ((this->_emitHelper)._avxEnabled != false) {
                instId = 0x4c0;
              }
              EVar2 = BaseEmitter::_emitI(&((this->super_BaseRAPass).super_FuncPass.super_Pass._cb)
                                           ->super_BaseEmitter,instId,&local_58,(Operand_ *)&src);
              if (EVar2 != 0) {
                return EVar2;
              }
            }
          }
        }
      }
    }
    else {
      if (invokeNode->field_0x81 != ' ') {
        return 3;
      }
      uVar9 = 0;
      for (sVar8 = 0; sVar8 != local_48; sVar8 = sVar8 + 1) {
        pFVar3 = FuncDetail::argPack(this_00,sVar8);
        for (sVar7 = 0; sVar7 != 4; sVar7 = sVar7 + 1) {
          pFVar4 = FuncValuePack::operator[](pFVar3,sVar7);
          uVar1 = pFVar4->_data;
          if (uVar1 == 0) break;
          if ((uVar1 >> 8 & 1) != 0) {
            local_58._signature._bits._0_1_ = (char)(uVar1 >> 0x18);
            pOVar5 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                     operator[]<asmjit::v1_14::RegType>
                               ((Array<asmjit::v1_14::OperandSignature,_32UL> *)(_archTraits + 0xec)
                                ,(RegType *)&local_58);
            uVar9 = uVar9 + ((pOVar5->_bits & 0xf00) == 0x100);
          }
        }
      }
      this_01 = (this->super_BaseRAPass).super_FuncPass.super_Pass._cb;
      if (uVar9 == 0) {
        EVar2 = EmitterExplicitT<asmjit::v1_14::x86::Compiler>::xor_
                          ((EmitterExplicitT<asmjit::v1_14::x86::Compiler> *)this_01,(Gp *)regs::eax
                           ,(Gp *)regs::eax);
      }
      else {
        local_58._signature._bits = 4;
        local_58._baseId = 0;
        local_58._data[1] = 0;
        local_58._data[0] = uVar9;
        EVar2 = EmitterExplicitT<asmjit::v1_14::x86::Compiler>::mov
                          ((EmitterExplicitT<asmjit::v1_14::x86::Compiler> *)this_01,(Gp *)regs::eax
                           ,(Imm *)&local_58);
      }
      if (EVar2 != 0) {
        return EVar2;
      }
    }
  }
  return 0;
}

Assistant:

Error X86RAPass::emitPreCall(InvokeNode* invokeNode) noexcept {
  if (invokeNode->detail().hasVarArgs() && cc()->is64Bit()) {
    const FuncDetail& fd = invokeNode->detail();
    uint32_t argCount = invokeNode->argCount();

    switch (invokeNode->detail().callConv().id()) {
      case CallConvId::kX64SystemV: {
        // AL register contains the number of arguments passed in XMM register(s).
        uint32_t n = 0;
        for (uint32_t argIndex = 0; argIndex < argCount; argIndex++) {
          const FuncValuePack& argPack = fd.argPack(argIndex);
          for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
            const FuncValue& arg = argPack[valueIndex];
            if (!arg)
              break;

            if (arg.isReg() && Reg::groupOf(arg.regType()) == RegGroup::kVec)
              n++;
          }
        }

        if (!n)
          ASMJIT_PROPAGATE(cc()->xor_(eax, eax));
        else
          ASMJIT_PROPAGATE(cc()->mov(eax, n));
        break;
      }

      case CallConvId::kX64Windows: {
        // Each double-precision argument passed in XMM must be also passed in GP.
        for (uint32_t argIndex = 0; argIndex < argCount; argIndex++) {
          const FuncValuePack& argPack = fd.argPack(argIndex);
          for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
            const FuncValue& arg = argPack[valueIndex];
            if (!arg)
              break;

            if (arg.isReg() && Reg::groupOf(arg.regType()) == RegGroup::kVec) {
              Gp dst = gpq(fd.callConv().passedOrder(RegGroup::kGp)[argIndex]);
              Xmm src = xmm(arg.regId());
              ASMJIT_PROPAGATE(cc()->emit(choose(Inst::kIdMovq, Inst::kIdVmovq), dst, src));
            }
          }
        }
        break;
      }

      default:
        return DebugUtils::errored(kErrorInvalidState);
    }
  }

  return kErrorOk;
}